

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalNinjaGenerator::AddMacOSXContentRule(cmGlobalNinjaGenerator *this)

{
  value_type pcVar1;
  reference ppcVar2;
  string *source;
  ostream *poVar3;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  string local_1b0;
  undefined1 local_190 [8];
  ostringstream cmd;
  cmLocalGenerator *lg;
  cmGlobalNinjaGenerator *this_local;
  
  ppcVar2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                        LocalGenerators,0);
  pcVar1 = *ppcVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  source = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  cmOutputConverter::ConvertToOutputFormat(&local_1b0,&pcVar1->super_cmOutputConverter,source,SHELL)
  ;
  poVar3 = std::operator<<((ostream *)local_190,(string *)&local_1b0);
  std::operator<<(poVar3," -E copy $in $out");
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"COPY_OSX_CONTENT",&local_1e1);
  std::__cxx11::ostringstream::str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"Copying OS X Content $out",&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"Rule for copying OS X bundle content file.",&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"",&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"",&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"",&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"",&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"",&local_319);
  AddRule(this,&local_1e0,&local_208,&local_228,&local_250,&local_278,&local_2a0,&local_2c8,
          &local_2f0,&local_318,false);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddMacOSXContentRule()
{
  cmLocalGenerator* lg = this->LocalGenerators[0];

  std::ostringstream cmd;
  cmd << lg->ConvertToOutputFormat(cmSystemTools::GetCMakeCommand(),
                                   cmOutputConverter::SHELL)
      << " -E copy $in $out";

  this->AddRule("COPY_OSX_CONTENT", cmd.str(), "Copying OS X Content $out",
                "Rule for copying OS X bundle content file.",
                /*depfile*/ "",
                /*deptype*/ "",
                /*rspfile*/ "",
                /*rspcontent*/ "",
                /*restat*/ "",
                /*generator*/ false);
}